

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O3

void Rnm_ManJustifyPropFanout_rec(Rnm_Man_t *p,Gia_Obj_t *pObj,int f,Vec_Int_t *vSelect)

{
  Rnm_Obj_t RVar1;
  int iVar2;
  Rnm_Obj_t *pRVar3;
  int *piVar4;
  bool bVar5;
  Gia_Obj_t *pGVar6;
  Rnm_Obj_t RVar7;
  int iVar8;
  Gia_Man_t *pGVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  
  uVar15 = *(ulong *)pObj;
  uVar14 = pObj->Value;
  iVar11 = f;
  while (uVar14 != 0 || (~uVar15 & 0x1fffffff1fffffff) == 0) {
    if (p->nObjsFrame <= (int)uVar14) goto LAB_0057a2e8;
    if ((f < 0) || (p->pCex->iFrame < iVar11)) goto LAB_0057a2aa;
    iVar12 = p->nObjsFrame * iVar11;
    pRVar3 = p->pObjs;
    if (((uint)pRVar3[(long)iVar12 + (ulong)uVar14] & 2) != 0) {
      __assert_fail("pRnm->fVisit == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                    ,0x1db,
                    "void Rnm_ManJustifyPropFanout_rec(Rnm_Man_t *, Gia_Obj_t *, int, Vec_Int_t *)")
      ;
    }
    RVar7 = (Rnm_Obj_t)((uint)pRVar3[(long)iVar12 + (ulong)uVar14] | 2);
    pRVar3[(long)iVar12 + (ulong)uVar14] = RVar7;
    uVar13 = pObj->Value;
    if (uVar13 == 0 && (~*(ulong *)pObj & 0x1fffffff1fffffff) != 0) break;
    if (p->nObjsFrame <= (int)uVar13) goto LAB_0057a2e8;
    if (p->pCex->iFrame < 0) goto LAB_0057a2aa;
    RVar1 = p->pObjs[uVar13];
    if (((uint)RVar1 & 4) == 0) {
      p->pObjs[uVar13] = (Rnm_Obj_t)((uint)RVar1 | 4);
      p->nVisited = p->nVisited + 1;
      RVar7 = pRVar3[(long)iVar12 + (ulong)uVar14];
    }
    if (((uint)RVar7 & 8) != 0) {
      if (((uint)RVar7 & 0xffffff0) == 0) {
        __assert_fail("(int)pRnm->Prio > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                      ,0x1e4,
                      "void Rnm_ManJustifyPropFanout_rec(Rnm_Man_t *, Gia_Obj_t *, int, Vec_Int_t *)"
                     );
      }
      iVar11 = p->pCex->iFrame;
      if (-1 < iVar11) goto LAB_00579f81;
      goto LAB_00579ff0;
    }
    uVar15 = *(ulong *)pObj;
    uVar14 = (uint)uVar15;
    if (((uVar15 & 0x1fffffff) != 0x1fffffff && (int)uVar14 < 0) && (iVar11 == p->pCex->iFrame)) {
      return;
    }
    pGVar9 = p->pGia;
    iVar12 = (int)(uVar15 & 0x1fffffff);
    uVar13 = (uint)(uVar15 >> 0x20);
    if ((-1 < (int)uVar14) || (iVar12 == 0x1fffffff)) {
      if ((~uVar14 & 0x9fffffff) == 0) {
        if (((int)uVar14 < 0 || iVar12 == 0x1fffffff) &&
           ((int)(uVar13 & 0x1fffffff) < pGVar9->vCis->nSize - pGVar9->nRegs)) {
LAB_0057a3a2:
          __assert_fail("Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                        ,500,
                        "void Rnm_ManJustifyPropFanout_rec(Rnm_Man_t *, Gia_Obj_t *, int, Vec_Int_t *)"
                       );
        }
      }
      else if (((int)uVar14 < 0) || (iVar12 == 0x1fffffff)) goto LAB_0057a3a2;
      pGVar6 = pGVar9->pObjs;
      if (pObj < pGVar6) goto LAB_0057a28b;
      iVar12 = 0;
      goto LAB_0057a0a0;
    }
    uVar13 = uVar13 & 0x1fffffff;
    iVar12 = pGVar9->vCos->nSize;
    if ((int)uVar13 < iVar12 - pGVar9->nRegs) {
      return;
    }
    iVar2 = pGVar9->vCis->nSize;
    uVar13 = (iVar2 - iVar12) + uVar13;
    if (((int)uVar13 < 0) || (iVar2 <= (int)uVar13)) goto LAB_0057a2c9;
    iVar12 = pGVar9->vCis->pArray[uVar13];
    lVar16 = (long)iVar12;
    if ((lVar16 < 0) || (pGVar9->nObjs <= iVar12)) goto LAB_0057a326;
    pGVar6 = pGVar9->pObjs;
    uVar15 = *(ulong *)(pGVar6 + lVar16);
    uVar14 = pGVar6[lVar16].Value;
    if (uVar14 == 0 && (~uVar15 & 0x1fffffff1fffffff) != 0) break;
    if (p->nObjsFrame <= (int)uVar14) goto LAB_0057a2e8;
    if (p->pCex->iFrame <= iVar11) goto LAB_0057a2aa;
    pObj = pGVar6 + lVar16;
    iVar11 = iVar11 + 1;
    if (((uint)p->pObjs[(long)(p->nObjsFrame * iVar11) + (ulong)uVar14] & 2) != 0) {
      return;
    }
  }
LAB_0057a307:
  __assert_fail("Gia_ObjIsConst0(pObj) || pObj->Value",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.h"
                ,0x5f,"Rnm_Obj_t *Rnm_ManObj(Rnm_Man_t *, Gia_Obj_t *, int)");
  while( true ) {
    if (p->nObjsFrame <= (int)uVar14) goto LAB_0057a2e8;
    if (p->pCex->iFrame < iVar11) goto LAB_0057a2aa;
    if (((uint)p->pObjs[(long)(p->nObjsFrame * iVar11) + (ulong)uVar14] & 2) == 0) {
      Rnm_ManJustifyPropFanout_rec(p,pObj,iVar11,vSelect);
    }
    bVar5 = iVar11 < 1;
    iVar11 = iVar11 + -1;
    if (bVar5) break;
LAB_00579f81:
    uVar14 = pObj->Value;
    if (uVar14 == 0 && (~*(ulong *)pObj & 0x1fffffff1fffffff) != 0) goto LAB_0057a307;
  }
LAB_00579ff0:
  pGVar6 = p->pGia->pObjs;
  if ((pGVar6 <= pObj) && (pObj < pGVar6 + p->pGia->nObjs)) {
    Vec_IntPush(vSelect,(int)((ulong)((long)pObj - (long)pGVar6) >> 2) * -0x55555555);
    return;
  }
  goto LAB_0057a28b;
LAB_0057a0a0:
  do {
    if (pGVar6 + pGVar9->nObjs <= pObj) break;
    uVar14 = (int)((long)pObj - (long)pGVar6 >> 2) * -0x55555555;
    if (((int)uVar14 < 0) || (pGVar9->vFanoutNums->nSize <= (int)uVar14)) {
LAB_0057a2c9:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if (pGVar9->vFanoutNums->pArray[uVar14 & 0x7fffffff] <= iVar12) {
      return;
    }
    uVar13 = pGVar9->vFanout->nSize;
    if ((int)uVar13 <= (int)uVar14) goto LAB_0057a2c9;
    piVar4 = pGVar9->vFanout->pArray;
    uVar14 = piVar4[uVar14 & 0x7fffffff] + iVar12;
    if (((int)uVar14 < 0) || (uVar13 <= uVar14)) goto LAB_0057a2c9;
    iVar2 = piVar4[uVar14];
    lVar16 = (long)iVar2;
    if ((lVar16 < 0) || (pGVar9->nObjs <= iVar2)) {
LAB_0057a326:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    uVar14 = pGVar6[lVar16].Value;
    if ((ulong)uVar14 != 0) {
      iVar2 = p->nObjsFrame;
      if (iVar2 <= (int)uVar14) goto LAB_0057a2e8;
      if (p->pCex->iFrame < iVar11) {
LAB_0057a2aa:
        __assert_fail("f >= 0 && f <= p->pCex->iFrame",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.h"
                      ,0x61,"Rnm_Obj_t *Rnm_ManObj(Rnm_Man_t *, Gia_Obj_t *, int)");
      }
      iVar8 = iVar2 * iVar11;
      pRVar3 = p->pObjs;
      if (((uint)pRVar3[(long)iVar8 + (ulong)uVar14] & 10) == 0) {
        pGVar6 = pGVar6 + lVar16;
        uVar15 = *(ulong *)pGVar6;
        uVar17 = uVar15 & 0x1fffffff;
        if (-1 < (int)uVar15 || uVar17 == 0x1fffffff) {
          if (((int)uVar15 < 0) || ((int)uVar17 == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(pFanout)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                          ,0x202,
                          "void Rnm_ManJustifyPropFanout_rec(Rnm_Man_t *, Gia_Obj_t *, int, Vec_Int_t *)"
                         );
          }
          uVar14 = pGVar6[-uVar17].Value;
          if (uVar14 == 0 && (~*(ulong *)(pGVar6 + -uVar17) & 0x1fffffff1fffffff) != 0)
          goto LAB_0057a307;
          if (iVar2 <= (int)uVar14) {
LAB_0057a2e8:
            __assert_fail("(int)pObj->Value < p->nObjsFrame",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.h"
                          ,0x60,"Rnm_Obj_t *Rnm_ManObj(Rnm_Man_t *, Gia_Obj_t *, int)");
          }
          uVar18 = (uint)(uVar15 >> 0x20);
          uVar17 = (ulong)(uVar18 & 0x1fffffff);
          uVar13 = pGVar6[-uVar17].Value;
          if (uVar13 == 0 && (~*(ulong *)(pGVar6 + -uVar17) & 0x1fffffff1fffffff) != 0)
          goto LAB_0057a307;
          if (iVar2 <= (int)uVar13) goto LAB_0057a2e8;
          uVar10 = ((uint)(uVar15 >> 0x1d) & 7 ^ (uint)pRVar3[(long)iVar8 + (ulong)uVar14]) & 1;
          uVar14 = (uint)pRVar3[(long)iVar8 + (ulong)uVar14] & 2;
          if ((uVar14 == 0) || (uVar10 != 0)) {
            RVar7 = pRVar3[(long)iVar8 + (ulong)uVar13];
            uVar13 = uVar18 >> 0x1d ^ (uint)RVar7;
            if (((((uint)RVar7 & 2) == 0) || ((uVar13 & 1) != 0)) &&
               (((uVar14 & (uint)RVar7) == 0 || ((uVar10 & uVar13) == 0)))) goto LAB_0057a278;
          }
        }
        Rnm_ManJustifyPropFanout_rec(p,pGVar6,iVar11,vSelect);
      }
    }
LAB_0057a278:
    iVar12 = iVar12 + 1;
    pGVar9 = p->pGia;
    pGVar6 = pGVar9->pObjs;
  } while (pGVar6 <= pObj);
LAB_0057a28b:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Rnm_ManJustifyPropFanout_rec( Rnm_Man_t * p, Gia_Obj_t * pObj, int f, Vec_Int_t * vSelect )
{
    Rnm_Obj_t * pRnm0, * pRnm1, * pRnm = Rnm_ManObj( p, pObj, f );
    Gia_Obj_t * pFanout = NULL;
    int i, k;//, Id = Gia_ObjId(p->pGia, pObj);
    assert( pRnm->fVisit == 0 );
    pRnm->fVisit = 1;
    if ( Rnm_ManObj( p, pObj, 0 )->fVisitJ == 0 )
    {
        Rnm_ManObj( p, pObj, 0 )->fVisitJ = 1;
        p->nVisited++;
    }
    if ( pRnm->fPPi )
    {
        assert( (int)pRnm->Prio > 0 );
        for ( i = p->pCex->iFrame; i >= 0; i-- )
            if ( !Rnm_ManObj(p, pObj, i)->fVisit )
                Rnm_ManJustifyPropFanout_rec( p, pObj, i, vSelect );
        Vec_IntPush( vSelect, Gia_ObjId(p->pGia, pObj) );
        return;
    }
    if ( (Gia_ObjIsCo(pObj) && f == p->pCex->iFrame) || Gia_ObjIsPo(p->pGia, pObj) )
        return;
    if ( Gia_ObjIsRi(p->pGia, pObj) )
    {
        pFanout = Gia_ObjRiToRo(p->pGia, pObj);
        if ( !Rnm_ManObj(p, pFanout, f+1)->fVisit )
            Rnm_ManJustifyPropFanout_rec( p, pFanout, f+1, vSelect );
        return;
    }
    assert( Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj) );
    Gia_ObjForEachFanoutStatic( p->pGia, pObj, pFanout, k )
    {
        Rnm_Obj_t * pRnmF;
        if ( pFanout->Value == 0 )
            continue;
        pRnmF = Rnm_ManObj(p, pFanout, f);
        if ( pRnmF->fPPi || pRnmF->fVisit )
            continue;
        if ( Gia_ObjIsCo(pFanout) )
        {
            Rnm_ManJustifyPropFanout_rec( p, pFanout, f, vSelect );
            continue;
        } 
        assert( Gia_ObjIsAnd(pFanout) );
        pRnm0 = Rnm_ManObj( p, Gia_ObjFanin0(pFanout), f );
        pRnm1 = Rnm_ManObj( p, Gia_ObjFanin1(pFanout), f );
        if ( ((pRnm0->Value ^ Gia_ObjFaninC0(pFanout)) == 0 && pRnm0->fVisit) ||
             ((pRnm1->Value ^ Gia_ObjFaninC1(pFanout)) == 0 && pRnm1->fVisit) || 
           ( ((pRnm0->Value ^ Gia_ObjFaninC0(pFanout)) == 1 && pRnm0->fVisit) && 
             ((pRnm1->Value ^ Gia_ObjFaninC1(pFanout)) == 1 && pRnm1->fVisit) ) )
           Rnm_ManJustifyPropFanout_rec( p, pFanout, f, vSelect );
    }
}